

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

BinsSelectExpressionSyntax * __thiscall slang::parsing::Parser::parseBinsSelectPrimary(Parser *this)

{
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  BinSelectWithFilterExprSyntax *expr;
  BinsSelectConditionExprSyntax *expr_00;
  BinsSelectExpressionSyntax *expr_01;
  ExpressionSyntax *expr_02;
  ExpressionSyntax *pEVar3;
  ExpressionPatternSyntax *pEVar4;
  MatchesClauseSyntax *pMVar5;
  Token TVar6;
  Token TVar7;
  Token TVar8;
  Token matchesKeyword;
  anon_class_8_1_8991fb9c parseCondition;
  anon_class_8_1_8991fb9c local_78;
  Info *local_70;
  undefined8 local_68;
  BinSelectWithFilterExprSyntax *local_60;
  Info *local_58;
  undefined8 local_50;
  ExpressionSyntax *local_48;
  undefined8 local_40;
  Info *pIStack_38;
  
  local_78.this = this;
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar6.kind;
  if (TVar2 == OpenParenthesis) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    expr_01 = parseBinsSelectExpression(this);
    TVar7 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    expr = (BinSelectWithFilterExprSyntax *)
           syntax::SyntaxFactory::parenthesizedBinsSelectExpr(&this->factory,TVar6,expr_01,TVar7);
  }
  else if (TVar2 == Exclamation) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    expr_00 = parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()(&local_78);
    expr = (BinSelectWithFilterExprSyntax *)
           syntax::SyntaxFactory::unaryBinsSelectExpr(&this->factory,TVar6,expr_00);
  }
  else if (TVar2 == BinsOfKeyword) {
    expr = (BinSelectWithFilterExprSyntax *)
           parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()(&local_78);
  }
  else {
    pMVar5 = (MatchesClauseSyntax *)0x0;
    pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
    bVar1 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
    if (bVar1) {
      TVar6 = ParserBase::consume(&this->super_ParserBase);
      expr_02 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
      pEVar4 = syntax::SyntaxFactory::expressionPattern(&this->factory,expr_02);
      pMVar5 = syntax::SyntaxFactory::matchesClause
                         (&this->factory,TVar6,&pEVar4->super_PatternSyntax);
    }
    expr = (BinSelectWithFilterExprSyntax *)
           syntax::SyntaxFactory::simpleBinsSelectExpr(&this->factory,pEVar3,pMVar5);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,WithKeyword);
  if (bVar1) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    TVar7 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    local_48 = parseExpression(this);
    TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    local_58 = TVar8.info;
    local_50 = TVar8._0_8_;
    bVar1 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
    if (bVar1) {
      TVar8 = ParserBase::consume(&this->super_ParserBase);
      local_70 = TVar8.info;
      local_68 = TVar8._0_8_;
      pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x40,0);
      local_60 = expr;
      pEVar4 = syntax::SyntaxFactory::expressionPattern(&this->factory,pEVar3);
      expr = local_60;
      matchesKeyword.info = local_70;
      matchesKeyword.kind = (undefined2)local_68;
      matchesKeyword._2_1_ = local_68._2_1_;
      matchesKeyword.numFlags.raw = local_68._3_1_;
      matchesKeyword.rawLen = local_68._4_4_;
      pMVar5 = syntax::SyntaxFactory::matchesClause
                         (&this->factory,matchesKeyword,&pEVar4->super_PatternSyntax);
    }
    else {
      pMVar5 = (MatchesClauseSyntax *)0x0;
    }
    local_40 = local_50;
    pIStack_38 = local_58;
    closeParen.info = local_58;
    closeParen.kind = (undefined2)local_50;
    closeParen._2_1_ = local_50._2_1_;
    closeParen.numFlags.raw = local_50._3_1_;
    closeParen.rawLen = local_50._4_4_;
    expr = syntax::SyntaxFactory::binSelectWithFilterExpr
                     (&this->factory,&expr->super_BinsSelectExpressionSyntax,TVar6,TVar7,local_48,
                      closeParen,pMVar5);
  }
  return &expr->super_BinsSelectExpressionSyntax;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectPrimary() {
    auto parseCondition = [&]() -> BinsSelectConditionExprSyntax& {
        auto binsof = expect(TokenKind::BinsOfKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& name = parseName();
        auto closeParen = expect(TokenKind::CloseParenthesis);

        IntersectClauseSyntax* intersectClause = nullptr;
        if (peek(TokenKind::IntersectKeyword)) {
            auto intersect = consume();
            auto& ranges = parseRangeList();
            intersectClause = &factory.intersectClause(intersect, ranges);
        }

        return factory.binsSelectConditionExpr(binsof, openParen, name, closeParen,
                                               intersectClause);
    };

    auto parseMatches = [&] {
        MatchesClauseSyntax* matchesClause = nullptr;
        if (peek(TokenKind::MatchesKeyword)) {
            auto matches = consume();
            auto& matchExpr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            matchesClause = &factory.matchesClause(matches, factory.expressionPattern(matchExpr));
        }
        return matchesClause;
    };

    BinsSelectExpressionSyntax* result;
    switch (peek().kind) {
        case TokenKind::BinsOfKeyword:
            result = &parseCondition();
            break;
        case TokenKind::Exclamation: {
            auto op = consume();
            result = &factory.unaryBinsSelectExpr(op, parseCondition());
            break;
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseBinsSelectExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            result = &factory.parenthesizedBinsSelectExpr(openParen, expr, closeParen);
            break;
        }
        default: {
            auto& expr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            auto matches = parseMatches();
            result = &factory.simpleBinsSelectExpr(expr, matches);
            break;
        }
    }

    if (peek(TokenKind::WithKeyword)) {
        auto with = consume();
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpression();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto matches = parseMatches();
        result = &factory.binSelectWithFilterExpr(*result, with, openParen, expr, closeParen,
                                                  matches);
    }

    return *result;
}